

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_convert_422jpeg_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  int _c_h;
  int iVar2;
  int iVar3;
  int _c_w;
  int iVar4;
  uchar *_dst_00;
  bool bVar5;
  
  iVar1 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  _dst_00 = _dst + _c_h * iVar1;
  _c_w = (iVar1 + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  iVar2 = _y4m->dst_c_dec_h;
  iVar3 = _y4m->dst_c_dec_v;
  iVar4 = 2;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    y4m_422jpeg_420jpeg_helper(_dst_00,_aux,_c_w,_c_h);
    _aux = _aux + _c_w * _c_h;
    _dst_00 = _dst_00 + ((_c_h + iVar3 + -1) / iVar3) * ((iVar1 + iVar2 + -1) / iVar2);
  }
  return;
}

Assistant:

static void y4m_convert_422jpeg_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                        unsigned char *_aux) {
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int pli;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  for (pli = 1; pli < 3; pli++) {
    y4m_422jpeg_420jpeg_helper(_dst, _aux, c_w, c_h);
    _aux += c_sz;
    _dst += dst_c_sz;
  }
}